

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O1

bool picojson::
     _parse<picojson::default_parse_context,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
               (default_parse_context *ctx,
               input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *in)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  lconv *plVar5;
  int *piVar6;
  intmax_t i;
  FILE *__stream;
  char *pcVar7;
  size_t sVar8;
  double f;
  string num_str;
  char *endp;
  char *local_58;
  long local_50;
  undefined4 local_48;
  uint uStack_44;
  char *local_38;
  
  __stream = (FILE *)in;
  do {
    uVar3 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::getc(in,__stream);
    if (0x20 < uVar3) break;
  } while ((0x100002600U >> ((ulong)uVar3 & 0x3f) & 1) != 0);
  in->consumed_ = false;
  iVar4 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::getc(in,__stream);
  if (iVar4 < 0x6e) {
    if (iVar4 == 0x22) {
      bVar2 = default_parse_context::
              parse_string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(ctx,in);
      return bVar2;
    }
    if (iVar4 == 0x5b) {
      bVar2 = default_parse_context::parse_array_start(ctx);
      if (!bVar2) {
        return false;
      }
      bVar2 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::expect(in,0x5d);
      if (!bVar2) {
        sVar8 = 0;
        do {
          bVar2 = default_parse_context::
                  parse_array_item<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                            (ctx,in,sVar8);
          if (!bVar2) {
            return false;
          }
          sVar8 = sVar8 + 1;
          bVar2 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::expect(in,0x2c);
        } while (bVar2);
        bVar2 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::expect(in,0x5d);
        return bVar2;
      }
      return true;
    }
    if (iVar4 != 0x66) {
LAB_00108120:
      if (iVar4 != 0x2d && 9 < iVar4 - 0x30U) {
        in->consumed_ = false;
        return false;
      }
      in->consumed_ = false;
      local_50 = 0;
      local_48 = local_48 & 0xffffff00;
      local_58 = (char *)&local_48;
      do {
        while (iVar4 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::getc(in,__stream), iVar4 - 0x30U < 10) {
LAB_00108183:
          __stream = (FILE *)(ulong)(uint)(int)(char)iVar4;
          std::__cxx11::string::push_back((char)&local_58);
        }
        uVar3 = iVar4 - 0x2b;
        if (0x3a < uVar3) goto LAB_0010829d;
        if ((0x400000004000005U >> ((ulong)uVar3 & 0x3f) & 1) != 0) goto LAB_00108183;
        if ((ulong)uVar3 != 3) goto LAB_0010829d;
        plVar5 = localeconv();
        __stream = (FILE *)plVar5->decimal_point;
        std::__cxx11::string::append((char *)&local_58);
      } while( true );
    }
    local_58 = (char *)&local_48;
    local_48 = 0x65736c61;
    local_50 = 4;
    uStack_44 = uStack_44 & 0xffffff00;
    iVar4 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::getc(in,__stream);
    if (iVar4 == (char)local_48) {
      pcVar7 = (char *)((long)&local_48 + 1);
      do {
        if (pcVar7 == local_58 + local_50) {
          bVar2 = default_parse_context::set_bool(ctx,false);
LAB_0010832b:
          if (local_58 != (char *)&local_48) {
            operator_delete(local_58,CONCAT44(uStack_44,local_48) + 1);
          }
          if (bVar2 == false) {
            return false;
          }
          return true;
        }
        iVar4 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::getc(in,__stream);
        cVar1 = *pcVar7;
        pcVar7 = pcVar7 + 1;
      } while (iVar4 == cVar1);
    }
  }
  else {
    if (iVar4 == 0x7b) {
      bVar2 = _parse_object<picojson::default_parse_context,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        (ctx,in);
      return bVar2;
    }
    if (iVar4 == 0x74) {
      local_58 = (char *)&local_48;
      local_48 = 0x657572;
      local_50 = 3;
      iVar4 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::getc(in,__stream);
      if (iVar4 == (char)local_48) {
        pcVar7 = (char *)((long)&local_48 + 1);
        do {
          if (pcVar7 == local_58 + local_50) {
            bVar2 = default_parse_context::set_bool(ctx,true);
            goto LAB_0010832b;
          }
          iVar4 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::getc(in,__stream);
          cVar1 = *pcVar7;
          pcVar7 = pcVar7 + 1;
        } while (iVar4 == cVar1);
      }
    }
    else {
      if (iVar4 != 0x6e) goto LAB_00108120;
      local_58 = (char *)&local_48;
      local_48 = 0x6c6c75;
      local_50 = 3;
      iVar4 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::getc(in,__stream);
      if (iVar4 == (char)local_48) {
        pcVar7 = (char *)((long)&local_48 + 1);
        do {
          if (pcVar7 == local_58 + local_50) {
            bVar2 = default_parse_context::set_null(ctx);
            goto LAB_0010832b;
          }
          iVar4 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::getc(in,__stream);
          cVar1 = *pcVar7;
          pcVar7 = pcVar7 + 1;
        } while (iVar4 == cVar1);
      }
    }
  }
  in->consumed_ = false;
  if (local_58 != (char *)&local_48) {
    operator_delete(local_58,CONCAT44(uStack_44,local_48) + 1);
  }
  return false;
LAB_0010829d:
  in->consumed_ = false;
  if (local_50 != 0) {
    piVar6 = __errno_location();
    *piVar6 = 0;
    i = strtoimax(local_58,&local_38,10);
    if ((*piVar6 == 0) && (local_38 == local_58 + local_50)) {
      bVar2 = true;
      default_parse_context::set_int64(ctx,i);
      goto LAB_00108378;
    }
    f = strtod(local_58,&local_38);
    if (local_38 == local_58 + local_50) {
      bVar2 = true;
      default_parse_context::set_number(ctx,f);
      goto LAB_00108378;
    }
  }
  bVar2 = false;
LAB_00108378:
  if (local_58 != (char *)&local_48) {
    operator_delete(local_58,CONCAT44(uStack_44,local_48) + 1);
  }
  return bVar2;
}

Assistant:

inline bool _parse(Context &ctx, input<Iter> &in) {
  in.skip_ws();
  int ch = in.getc();
  switch (ch) {
#define IS(ch, text, op)                                                                                                           \
  case ch:                                                                                                                         \
    if (in.match(text) && op) {                                                                                                    \
      return true;                                                                                                                 \
    } else {                                                                                                                       \
      return false;                                                                                                                \
    }
    IS('n', "ull", ctx.set_null());
    IS('f', "alse", ctx.set_bool(false));
    IS('t', "rue", ctx.set_bool(true));
#undef IS
  case '"':
    return ctx.parse_string(in);
  case '[':
    return _parse_array(ctx, in);
  case '{':
    return _parse_object(ctx, in);
  default:
    if (('0' <= ch && ch <= '9') || ch == '-') {
      double f;
      char *endp;
      in.ungetc();
      std::string num_str(_parse_number(in));
      if (num_str.empty()) {
        return false;
      }
#ifdef PICOJSON_USE_INT64
      {
        errno = 0;
        intmax_t ival = strtoimax(num_str.c_str(), &endp, 10);
        if (errno == 0 && std::numeric_limits<int64_t>::min() <= ival && ival <= std::numeric_limits<int64_t>::max() &&
            endp == num_str.c_str() + num_str.size()) {
          ctx.set_int64(ival);
          return true;
        }
      }
#endif
      f = strtod(num_str.c_str(), &endp);
      if (endp == num_str.c_str() + num_str.size()) {
        ctx.set_number(f);
        return true;
      }
      return false;
    }
    break;
  }
  in.ungetc();
  return false;
}